

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdKelvinStencilEnable::emulate_mthd(MthdKelvinStencilEnable *this)

{
  pgraph_state *state;
  byte bVar1;
  _Bool _Var2;
  uint val;
  uint32_t err;
  bool bVar3;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_kelvin_check_err19(state);
  bVar3 = 1 < (this->super_SingleMthdTest).super_MthdTest.val;
  _Var2 = pgraph_in_begin_end(state);
  err = bVar3 + 4;
  if (!_Var2) {
    err = (uint32_t)bVar3;
  }
  if (err != 0) {
    MthdTest::warn((MthdTest *)this,err);
    return;
  }
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    return;
  }
  bVar1 = (byte)this->side;
  val = ((this->super_SingleMthdTest).super_MthdTest.val & 1) << (bVar1 & 0x3f) |
        ~(uint)(1L << (bVar1 & 0x3f)) &
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a = val;
  pgraph_bundle(state,0xd,0,val,true);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		uint32_t err = 0;
		if (val > 1)
			err |= 1;
		if (pgraph_in_begin_end(&exp))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!exp.nsource) {
				insrt(exp.bundle_stencil_a, side, 1, val);
				pgraph_bundle(&exp, BUNDLE_STENCIL_A, 0, exp.bundle_stencil_a, true);
			}
		}
	}